

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

void ast::Sections::binary_logisim
               (char *file_name,uint word_size,uint byte_order,uint lower_address,
               uint higher_address)

{
  byte bVar1;
  byte bVar2;
  ostream *this;
  bool bVar3;
  failure *e;
  uint j;
  uint8_t c;
  uint address;
  ostream local_220 [8];
  ofstream file;
  uint higher_address_local;
  uint lower_address_local;
  uint byte_order_local;
  uint word_size_local;
  char *file_name_local;
  
  std::ofstream::ofstream(local_220,file_name,0x10);
  this = std::operator<<(local_220,"v2.0 raw");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  j = lower_address + byte_order;
  while (j < higher_address) {
    bVar1 = Memory_space::read8((Memory_space *)memory,j);
    j = j + word_size;
    bVar2 = Memory_space::read8((Memory_space *)memory,j);
    if (bVar2 == bVar1) {
      e._0_4_ = 2;
      while( true ) {
        j = word_size + j;
        bVar3 = false;
        if (j < higher_address) {
          bVar2 = Memory_space::read8((Memory_space *)memory,j);
          bVar3 = bVar1 == bVar2;
        }
        if (!bVar3) break;
        e._0_4_ = (uint)e + 1;
      }
      ostream_printf(local_220," %d*%02x",(ulong)(uint)e,(ulong)bVar1);
    }
    else {
      ostream_printf(local_220," %02x",(ulong)bVar1);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void Sections::binary_logisim(const char *file_name,
								unsigned word_size, unsigned byte_order,
								unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		file << "v2.0 raw" << endl;
		for (auto address = lower_address + byte_order; address < higher_address; ) {
			uint8_t c = memory.read8(address);
			address += word_size;
			//	Quantos bytes iguais a este?
			if (memory.read8(address) == c) {
				auto j = 2U;
				for (address += word_size;
				     	address < higher_address && c == memory.read8(address);
					 		address += word_size, j++)
					;
				ostream_printf(file, " %d*%02x", j, static_cast<uint8_t >(c));
			}
			else
				ostream_printf(file, " %02x", static_cast<uint8_t >(c));
		}
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}